

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O0

void __thiscall Limiter::Limiter(Limiter *this,int maxRPS,int timeFramesPS)

{
  anon_class_8_1_8991fb9c local_70;
  function<void_()> local_68;
  int local_34;
  duration<long,_std::ratio<1L,_1L>_> local_30;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  microseconds local_20;
  int local_18;
  int local_14;
  int timeFramesPS_local;
  int maxRPS_local;
  Limiter *this_local;
  
  local_18 = timeFramesPS;
  local_14 = maxRPS;
  _timeFramesPS_local = this;
  std::mutex::mutex(&this->mutex_);
  HitQueue::HitQueue(&this->hitQueue_,local_18);
  local_34 = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_30,&local_34);
  local_28 = std::chrono::operator/(&local_30,&local_18);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&local_20,&local_28);
  local_70.this = this;
  std::function<void()>::function<Limiter::Limiter(int,int)::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_70);
  Tick::Tick(&this->tick_,local_20,&local_68);
  std::function<void_()>::~function(&local_68);
  this->maxRPS_ = local_14;
  return;
}

Assistant:

Limiter(int maxRPS, int timeFramesPS)
        : hitQueue_(timeFramesPS)
        // note that callbacks may start coming right after this
        , tick_(std::chrono::seconds(1) / timeFramesPS, [this] { OnTimeFrameBoundary(); })
        , maxRPS_(maxRPS)
    {
    }